

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteDisclaimer(cmGlobalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  poVar1 = std::operator<<(os,"# CMAKE generated file: DO NOT EDIT!\n");
  poVar1 = std::operator<<(poVar1,"# Generated by \"");
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
            (asStack_38,this);
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," Generator, CMake Version ");
  cmVersion::GetMajorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,".");
  cmVersion::GetMinorVersion();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n\n");
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteDisclaimer(std::ostream& os)
{
  os << "# CMAKE generated file: DO NOT EDIT!\n"
     << "# Generated by \"" << this->GetName() << "\""
     << " Generator, CMake Version " << cmVersion::GetMajorVersion() << "."
     << cmVersion::GetMinorVersion() << "\n\n";
}